

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

bool absl::lts_20250127::log_internal::EncodeVarint(uint64_t tag,uint64_t value,Span<char> *buf)

{
  bool bVar1;
  uint64_t value_00;
  size_t size;
  size_t size_00;
  size_type sVar2;
  size_t value_size;
  size_t tag_type_size;
  uint64_t tag_type;
  Span<char> *buf_local;
  uint64_t value_local;
  uint64_t tag_local;
  
  value_00 = MakeTagType(tag,kVarint);
  size = VarintSize(value_00);
  size_00 = VarintSize(value);
  sVar2 = Span<char>::size(buf);
  bVar1 = size + size_00 <= sVar2;
  if (bVar1) {
    anon_unknown_4::EncodeRawVarint(value_00,size,buf);
    anon_unknown_4::EncodeRawVarint(value,size_00,buf);
  }
  else {
    sVar2 = Span<char>::size(buf);
    Span<char>::remove_suffix(buf,sVar2);
  }
  return bVar1;
}

Assistant:

bool EncodeVarint(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kVarint);
  const size_t tag_type_size = VarintSize(tag_type);
  const size_t value_size = VarintSize(value);
  if (tag_type_size + value_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(value, value_size, buf);
  return true;
}